

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::ConvolutionParameter::SerializeWithCachedSizes
          (ConvolutionParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  ConvolutionParameter_Engine value;
  int32 value_00;
  UnknownFieldSet *unknown_fields;
  int local_58;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ConvolutionParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    uVar3 = num_output(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar3,output);
  }
  if ((uVar1 & 0x1000) != 0) {
    bVar2 = bias_term(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar2,output);
  }
  i_1 = 0;
  iVar4 = pad_size(this);
  for (; i_1 < iVar4; i_1 = i_1 + 1) {
    uVar3 = pad(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteUInt32(3,uVar3,output);
  }
  i_2 = 0;
  iVar4 = kernel_size_size(this);
  for (; i_2 < iVar4; i_2 = i_2 + 1) {
    uVar3 = kernel_size(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,uVar3,output);
  }
  if ((uVar1 & 0x2000) != 0) {
    uVar3 = group(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,uVar3,output);
  }
  i_3 = 0;
  iVar4 = stride_size(this);
  for (; i_3 < iVar4; i_3 = i_3 + 1) {
    uVar3 = stride(this,i_3);
    google::protobuf::internal::WireFormatLite::WriteUInt32(6,uVar3,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (7,(MessageLite *)this->weight_filler_,output);
  }
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (8,(MessageLite *)this->bias_filler_,output);
  }
  if ((uVar1 & 8) != 0) {
    uVar3 = pad_h(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(9,uVar3,output);
  }
  if ((uVar1 & 0x10) != 0) {
    uVar3 = pad_w(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,uVar3,output);
  }
  if ((uVar1 & 0x20) != 0) {
    uVar3 = kernel_h(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xb,uVar3,output);
  }
  if ((uVar1 & 0x40) != 0) {
    uVar3 = kernel_w(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xc,uVar3,output);
  }
  if ((uVar1 & 0x80) != 0) {
    uVar3 = stride_h(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xd,uVar3,output);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar3 = stride_w(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xe,uVar3,output);
  }
  if ((uVar1 & 0x200) != 0) {
    value = engine(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0xf,value,output);
  }
  if ((uVar1 & 0x800) != 0) {
    value_00 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x10,value_00,output);
  }
  if ((uVar1 & 0x400) != 0) {
    bVar2 = force_nd_im2col(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x11,bVar2,output);
  }
  local_58 = 0;
  iVar4 = dilation_size(this);
  for (; local_58 < iVar4; local_58 = local_58 + 1) {
    uVar3 = dilation(this,local_58);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x12,uVar3,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ConvolutionParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void ConvolutionParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.ConvolutionParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->num_output(), output);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->bias_term(), output);
  }

  // repeated uint32 pad = 3;
  for (int i = 0, n = this->pad_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      3, this->pad(i), output);
  }

  // repeated uint32 kernel_size = 4;
  for (int i = 0, n = this->kernel_size_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      4, this->kernel_size(i), output);
  }

  // optional uint32 group = 5 [default = 1];
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(5, this->group(), output);
  }

  // repeated uint32 stride = 6;
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      6, this->stride(i), output);
  }

  // optional .caffe.FillerParameter weight_filler = 7;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, *this->weight_filler_, output);
  }

  // optional .caffe.FillerParameter bias_filler = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, *this->bias_filler_, output);
  }

  // optional uint32 pad_h = 9 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(9, this->pad_h(), output);
  }

  // optional uint32 pad_w = 10 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->pad_w(), output);
  }

  // optional uint32 kernel_h = 11;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(11, this->kernel_h(), output);
  }

  // optional uint32 kernel_w = 12;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(12, this->kernel_w(), output);
  }

  // optional uint32 stride_h = 13;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(13, this->stride_h(), output);
  }

  // optional uint32 stride_w = 14;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(14, this->stride_w(), output);
  }

  // optional .caffe.ConvolutionParameter.Engine engine = 15 [default = DEFAULT];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      15, this->engine(), output);
  }

  // optional int32 axis = 16 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(16, this->axis(), output);
  }

  // optional bool force_nd_im2col = 17 [default = false];
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(17, this->force_nd_im2col(), output);
  }

  // repeated uint32 dilation = 18;
  for (int i = 0, n = this->dilation_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      18, this->dilation(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.ConvolutionParameter)
}